

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uchar digest [16];
  char str [14];
  byte local_38 [24];
  uchar local_20 [16];
  
  builtin_memcpy(local_20 + 8,"orld!",6);
  builtin_memcpy(local_20,"Hello, w",8);
  printf("\n  MD5(\'%s\') = ",local_20);
  iVar1 = mbedtls_md5_ret(local_20,0xd,local_38);
  iVar2 = 1;
  if (iVar1 == 0) {
    lVar3 = 0;
    do {
      printf("%02x",(ulong)local_38[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    puts("\n");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main( void )
{
    int i, ret;
    unsigned char digest[16];
    char str[] = "Hello, world!";

    mbedtls_printf( "\n  MD5('%s') = ", str );

    if( ( ret = mbedtls_md5_ret( (unsigned char *) str, 13, digest ) ) != 0 )
        return( MBEDTLS_EXIT_FAILURE );

    for( i = 0; i < 16; i++ )
        mbedtls_printf( "%02x", digest[i] );

    mbedtls_printf( "\n\n" );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( MBEDTLS_EXIT_SUCCESS );
}